

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initLexYaccFiles(VcprojGenerator *this)

{
  char *in_RDI;
  long in_FS_OFFSET;
  ProKey *in_stack_ffffffffffffff58;
  QMakeProject *this_00;
  QString *in_stack_ffffffffffffff68;
  ProStringList *fileList;
  VCFilter *in_stack_ffffffffffffff70;
  VCFilter *this_01;
  ProStringList local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QString::operator=(in_stack_ffffffffffffff68,in_RDI);
  in_RDI[0x2230] = '\0';
  in_RDI[0x2231] = '\0';
  in_RDI[0x2232] = '\0';
  in_RDI[0x2233] = '\0';
  QString::operator=(in_stack_ffffffffffffff68,in_RDI);
  QString::operator=(in_stack_ffffffffffffff68,in_RDI);
  this_00 = *(QMakeProject **)(in_RDI + 0xd8);
  fileList = local_38;
  ProKey::ProKey((ProKey *)this_00,(char *)in_stack_ffffffffffffff58);
  QMakeProject::values(this_00,in_stack_ffffffffffffff58);
  VCFilter::addFiles(in_stack_ffffffffffffff70,fileList);
  ProKey::~ProKey((ProKey *)0x292dda);
  this_01 = *(VCFilter **)(in_RDI + 0xd8);
  ProKey::ProKey((ProKey *)this_00,(char *)in_stack_ffffffffffffff58);
  QMakeProject::values(this_00,in_stack_ffffffffffffff58);
  VCFilter::addFiles(this_01,fileList);
  ProKey::~ProKey((ProKey *)0x292e27);
  *(char **)(in_RDI + 0x2238) = in_RDI;
  *(char **)(in_RDI + 0x2240) = in_RDI + 0x268;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initLexYaccFiles()
{
    vcProject.LexYaccFiles.Name = "Lex / Yacc Files";
    vcProject.LexYaccFiles.ParseFiles = _False;
    vcProject.LexYaccFiles.Filter = "l;y";
    vcProject.LexYaccFiles.Guid = _GUIDLexYaccFiles;

    vcProject.LexYaccFiles.addFiles(project->values("LEXSOURCES"));
    vcProject.LexYaccFiles.addFiles(project->values("YACCSOURCES"));

    vcProject.LexYaccFiles.Project = this;
    vcProject.LexYaccFiles.Config = &(vcProject.Configuration);
}